

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O3

bool xmrig::CudaLib::load(void)

{
  int iVar1;
  runtime_error *this;
  
  iVar1 = uv_dlsym(cudaLib,"version",&pVersion);
  if ((iVar1 != -1) && (iVar1 = (*pVersion)(0), iVar1 == 2)) {
    iVar1 = uv_dlsym(cudaLib,"alloc",&pAlloc);
    if (iVar1 == -1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"symbol not found");
    }
    else {
      iVar1 = uv_dlsym(cudaLib,"cnHash",&pCnHash);
      if (iVar1 == -1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"symbol not found");
      }
      else {
        iVar1 = uv_dlsym(cudaLib,"deviceCount",&pDeviceCount);
        if (iVar1 == -1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"symbol not found");
        }
        else {
          iVar1 = uv_dlsym(cudaLib,"deviceInfo",&pDeviceInfo);
          if (iVar1 == -1) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"symbol not found");
          }
          else {
            iVar1 = uv_dlsym(cudaLib,"deviceInit",&pDeviceInit);
            if (iVar1 == -1) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"symbol not found");
            }
            else {
              iVar1 = uv_dlsym(cudaLib,"deviceInt",&pDeviceInt);
              if (iVar1 == -1) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"symbol not found");
              }
              else {
                iVar1 = uv_dlsym(cudaLib,"deviceName",&pDeviceName);
                if (iVar1 == -1) {
                  this = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this,"symbol not found");
                }
                else {
                  iVar1 = uv_dlsym(cudaLib,"deviceUint",&pDeviceUint);
                  if (iVar1 == -1) {
                    this = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this,"symbol not found");
                  }
                  else {
                    iVar1 = uv_dlsym(cudaLib,"deviceUlong",&pDeviceUlong);
                    if (iVar1 == -1) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this,"symbol not found");
                    }
                    else {
                      iVar1 = uv_dlsym(cudaLib,"init",&pInit);
                      if (iVar1 == -1) {
                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this,"symbol not found");
                      }
                      else {
                        iVar1 = uv_dlsym(cudaLib,"lastError",&pLastError);
                        if (iVar1 == -1) {
                          this = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this,"symbol not found");
                        }
                        else {
                          iVar1 = uv_dlsym(cudaLib,"pluginVersion",&pPluginVersion);
                          if (iVar1 == -1) {
                            this = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(this,"symbol not found");
                          }
                          else {
                            iVar1 = uv_dlsym(cudaLib,"release",&pRelease);
                            if (iVar1 == -1) {
                              this = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(this,"symbol not found");
                            }
                            else {
                              iVar1 = uv_dlsym(cudaLib,"setJob",&pSetJob);
                              if (iVar1 == -1) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(this,"symbol not found");
                              }
                              else {
                                iVar1 = uv_dlsym(cudaLib,"version",&pVersion);
                                if (iVar1 != -1) {
                                  (*pInit)();
                                  return true;
                                }
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(this,"symbol not found");
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return false;
}

Assistant:

bool xmrig::CudaLib::load()
{
    if (uv_dlsym(&cudaLib, kVersion, reinterpret_cast<void**>(&pVersion)) == -1) {
        return false;
    }

    if (pVersion(ApiVersion) != 2u) {
        return false;
    }

    try {
        DLSYM(Alloc);
        DLSYM(CnHash);
        DLSYM(DeviceCount);
        DLSYM(DeviceInfo);
        DLSYM(DeviceInit);
        DLSYM(DeviceInt);
        DLSYM(DeviceName);
        DLSYM(DeviceUint);
        DLSYM(DeviceUlong);
        DLSYM(Init);
        DLSYM(LastError);
        DLSYM(PluginVersion);
        DLSYM(Release);
        DLSYM(SetJob);
        DLSYM(Version);
    } catch (std::exception &ex) {
        return false;
    }

    pInit();

    return true;
}